

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O2

void __thiscall cfd::Psbt::Verify(Psbt *this,OutPoint *outpoint)

{
  char cVar1;
  uint32_t index;
  const_iterator cVar2;
  CfdException *this_00;
  ByteData *stack;
  pointer pBVar3;
  ByteData scriptsig;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> witness_stack;
  uint local_658;
  function<cfd::core::ByteData256_(const_cfd::core::Transaction_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
  local_630;
  Transaction tx;
  TxIn txin;
  ScriptWitness local_540;
  UtxoData utxo;
  
  cVar2 = std::
          _Rb_tree<cfd::core::OutPoint,_cfd::core::OutPoint,_std::_Identity<cfd::core::OutPoint>,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
          ::find(&(this->verify_ignore_map_)._M_t,outpoint);
  if ((_Rb_tree_header *)cVar2._M_node ==
      &(this->verify_ignore_map_)._M_t._M_impl.super__Rb_tree_header) {
    cfd::core::Psbt::GetTransaction();
    index = GetTxInIndex(this,outpoint);
    cVar1 = cfd::core::Psbt::IsFinalizedInput((uint)this);
    if (cVar1 == '\0') {
      utxo.block_height =
           (long)
           "//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfd_psbt.cpp"
           + 99;
      utxo.block_hash._vptr_BlockHash._0_4_ = 0x251;
      utxo.block_hash.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = "Verify";
      core::logger::warn<>((CfdSourceLocation *)&utxo,"psbt txin not finalized yet.");
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&utxo,"psbt txin not finalized yet.",(allocator *)&txin);
      core::CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)&utxo);
      __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    GetUtxoData(&utxo,this,index,kMainnet);
    cfd::core::Transaction::GetTxIn((uint)&witness_stack);
    cfd::core::TxIn::TxIn(&txin,&utxo.txid,utxo.vout,local_658);
    core::AbstractTxInReference::~AbstractTxInReference((AbstractTxInReference *)&witness_stack);
    cfd::core::Psbt::GetTxInFinalScript((uint)&witness_stack,SUB81(this,0));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&scriptsig.data_,
               &(witness_stack.
                 super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                 _M_impl.super__Vector_impl_data._M_start)->data_);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&witness_stack);
    cVar1 = cfd::core::ByteData::IsEmpty();
    if (cVar1 == '\0') {
      cfd::core::Script::Script((Script *)&witness_stack,&scriptsig);
      cfd::core::AbstractTxIn::SetUnlockingScript((Script *)&txin);
      core::Script::~Script((Script *)&witness_stack);
    }
    cfd::core::Psbt::GetTxInFinalScript((uint)&witness_stack,SUB81(this,0));
    for (pBVar3 = witness_stack.
                  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pBVar3 != witness_stack.
                  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                  _M_impl.super__Vector_impl_data._M_finish; pBVar3 = pBVar3 + 1) {
      cfd::core::AbstractTxIn::AddScriptWitnessStack((ByteData *)&local_540);
      core::ScriptWitness::~ScriptWitness(&local_540);
    }
    local_630.super__Function_base._M_functor._8_8_ = 0;
    local_630.super__Function_base._M_functor._M_unused._M_object = CollectSighashByTx;
    local_630._M_invoker =
         std::
         _Function_handler<cfd::core::ByteData256_(const_cfd::core::Transaction_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*),_cfd::core::ByteData256_(*)(const_cfd::core::Transaction_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
         ::_M_invoke;
    local_630.super__Function_base._M_manager =
         std::
         _Function_handler<cfd::core::ByteData256_(const_cfd::core::Transaction_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*),_cfd::core::ByteData256_(*)(const_cfd::core::Transaction_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
         ::_M_manager;
    TransactionContextUtil::Verify<cfd::core::Transaction>
              (&tx,outpoint,&utxo,&txin.super_AbstractTxIn,&local_630);
    std::_Function_base::~_Function_base(&local_630.super__Function_base);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&witness_stack);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptsig);
    core::AbstractTxIn::~AbstractTxIn(&txin.super_AbstractTxIn);
    UtxoData::~UtxoData(&utxo);
    core::Transaction::~Transaction(&tx);
  }
  return;
}

Assistant:

void Psbt::Verify(const OutPoint& outpoint) const {
  if (verify_ignore_map_.find(outpoint) == verify_ignore_map_.end()) {
    auto tx = GetTransaction();
    uint32_t index = GetTxInIndex(outpoint);
    if (!IsFinalizedInput(index)) {
      warn(CFD_LOG_SOURCE, "psbt txin not finalized yet.");
      throw CfdException(
          CfdError::kCfdIllegalStateError, "psbt txin not finalized yet.");
    }

    UtxoData utxo = GetUtxoData(index);
    TxIn txin(utxo.txid, utxo.vout, tx.GetTxIn(index).GetSequence());
    ByteData scriptsig = cfd::core::Psbt::GetTxInFinalScript(index, false)[0];
    if (!scriptsig.IsEmpty()) txin.SetUnlockingScript(Script(scriptsig));
    auto witness_stack = cfd::core::Psbt::GetTxInFinalScript(index, true);
    for (const auto& stack : witness_stack) {
      txin.AddScriptWitnessStack(stack);
    }

    TransactionContextUtil::Verify<Transaction>(
        &tx, outpoint, utxo, &txin, CollectSighashByTx);
  }
}